

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedOffsetTable.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_orderedOffsetTable_findValueWithOffset
          (sysbvm_context_t *context,sysbvm_tuple_t table,uint32_t offset)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar8;
  bool bVar9;
  uint uVar7;
  
  if (table != 0) {
    uVar2 = 0;
    if (*(long *)(table + 0x10) != 0) {
      uVar1 = *(ulong *)(table + 0x18);
      bVar9 = (uVar1 & 0xf) != 0;
      if (!bVar9 && uVar1 != 0) {
        uVar2 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
      }
      uVar5 = 0;
      uVar4 = 0xffffffffffffffff;
      while (uVar3 = uVar2, uVar7 = (uint)uVar3, uVar6 = uVar7 - uVar5, uVar5 <= uVar7 && uVar6 != 0
            ) {
        uVar6 = uVar6 >> 1;
        uVar8 = (ulong)(uVar6 + uVar5);
        uVar2 = uVar8;
        if (*(uint *)(*(long *)(table + 0x10) + 0x10 + uVar8 * 4) <= offset) {
          uVar5 = uVar5 + uVar6 + 1;
          uVar2 = uVar3;
          uVar4 = uVar8;
        }
      }
      if (-1 < (long)uVar4) {
        if (bVar9 || uVar1 == 0) {
          uVar2 = 0;
        }
        else {
          uVar2 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
        }
        if (uVar4 < uVar2) {
          return *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar4 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedOffsetTable_findValueWithOffset(sysbvm_context_t *context, sysbvm_tuple_t table, uint32_t offset)
{
    (void)context;
    if(!table)
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedOffsetTable_t *offsetTable = (sysbvm_orderedOffsetTable_t*)table;
    if(!offsetTable->keys)
        return SYSBVM_NULL_TUPLE;

    size_t size = sysbvm_tuple_getSizeInSlots(offsetTable->values);
    uint32_t *offsets = (uint32_t*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(offsetTable->keys)->bytes;

    // Binary search
    uint32_t lower = 0;
    uint32_t upper = size;
    intptr_t bestFound = -1;
    while(lower < upper)
    {
        uint32_t middle = lower + (upper - lower) / 2;
        uint32_t entryPC = offsets[middle];
        if(entryPC <= offset)
        {
            lower = middle + 1;
            bestFound = middle;
        }
        else
        {
            upper = middle;
        }
    }

    if(bestFound < 0 || (size_t)bestFound >= sysbvm_array_getSize(offsetTable->values))
        return SYSBVM_NULL_TUPLE;

    return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(offsetTable->values)->pointers[bestFound];
}